

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

void VisitNestedScopes<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
               (ParseNode *pnodeScopeList,ParseNode *pnodeParent,
               ByteCodeGenerator *byteCodeGenerator,ParseNodeVisitor<SymCheck> prefix,
               ParseNodeVisitor<SymCheck> postfix,uint *pIndex,bool breakOnBodyScope)

{
  OpCode OVar1;
  ushort uVar2;
  uint uVar3;
  uint index;
  ParseableFunctionInfo *this;
  ParseNode *pnode;
  NestedArray this_00;
  FuncInfo *pFVar4;
  Scope *innerScope;
  Scope *innerScope_00;
  long lVar5;
  FunctionInfo *nestedFunc;
  FunctionBody *body;
  NestedArray *pNVar6;
  code *pcVar7;
  ParseNodeVisitor<SymCheck> postfix_00;
  ParseNodeVisitor<SymCheck> postfix_01;
  ParseNodeVisitor<SymCheck> postfix_02;
  ParseNodeVisitor<SymCheck> postfix_03;
  ParseNodeVisitor<SymCheck> postfix_04;
  ParseNodeVisitor<SymCheck> postfix_05;
  ParseNodeVisitor<SymCheck> postfix_06;
  ParseNodeVisitor<SymCheck> postfix_07;
  ParseNodeVisitor<SymCheck> postfix_08;
  anon_class_24_3_9710772a fn;
  anon_class_24_3_9710772a fn_00;
  ParseNodeVisitor<SymCheck> prefix_00;
  ParseNodeVisitor<SymCheck> prefix_01;
  ParseNodeVisitor<SymCheck> prefix_02;
  ParseNodeVisitor<SymCheck> prefix_03;
  ParseNodeVisitor<SymCheck> prefix_04;
  ParseNodeVisitor<SymCheck> prefix_05;
  ParseNodeVisitor<SymCheck> prefix_06;
  ParseNodeVisitor<SymCheck> prefix_07;
  ParseNodeVisitor<SymCheck> prefix_08;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *p_Var8;
  bool bVar9;
  charcount_t cVar10;
  Type TVar11;
  ParseNodeFnc *pPVar12;
  ParseNodeBlock *pPVar13;
  ParseNodeCatch *pnodeCatch;
  ParseNodeWith *pPVar14;
  ParseNodeBlock *pPVar15;
  ParseNodeBin *pPVar16;
  FunctionProxy *pFVar17;
  undefined4 *puVar18;
  byte bVar19;
  Type TVar20;
  ParseNodePtr pnode_00;
  ParseableFunctionInfo *reuseNestedFunc;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr **pp_Stack_88;
  bool isMergedScope;
  ParseNodeVisitor<SymCheck> *local_78;
  FuncInfo *local_70;
  ParseableFunctionInfo *local_68;
  uint *local_60;
  uint local_54;
  undefined4 *puStack_50;
  uint i;
  SymCheck *local_48;
  ParseNodeVisitor<SymCheck> prefix_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  
  prefix_local.m_context = (SymCheck *)prefix.m_fn;
  local_48 = prefix.m_context;
  local_60 = pIndex;
  prefix_local.m_fn =
       (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)byteCodeGenerator;
  pPVar12 = ParseNode::AsParseNodeFnc(pnodeParent);
  local_70 = pPVar12->funcInfo;
  local_68 = local_70->byteCodeFunction;
  local_54 = 0;
  if (pnodeScopeList != (ParseNode *)0x0) {
    this = *(ParseableFunctionInfo **)(prefix_local.m_fn + 0x1c8);
    puStack_50 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      if ((breakOnBodyScope) &&
         (pPVar12 = ParseNode::AsParseNodeFnc(pnodeParent),
         (ParseNodeBlock *)pnodeScopeList == pPVar12->pnodeBodyScope)) {
        return;
      }
      OVar1 = (((ParseNodeBlock *)pnodeScopeList)->super_ParseNodeStmt).super_ParseNode.nop;
      if (OVar1 < knopWith) {
        if (OVar1 == knopFncDecl) {
          pPVar12 = ParseNode::AsParseNodeFnc(pnodeScopeList);
          p_Var8 = prefix_local.m_fn;
          if (this != (ParseableFunctionInfo *)0x0) {
            bVar9 = Js::ScriptContext::IsScriptContextInNonDebugMode
                              (*(ScriptContext **)prefix_local.m_fn);
            if ((bVar9) || ((*(byte *)(*(long *)(p_Var8 + 0x1b8) + 0xa8) & 4) != 0)) {
              if (((local_68->super_FunctionProxy).field_0x46 & 0x10) != 0) goto LAB_008408d2;
LAB_008408c4:
              pFVar17 = (FunctionProxy *)0x0;
            }
            else {
              uVar2 = *(ushort *)&(this->super_FunctionProxy).field_0x45;
              if ((uVar2 >> 0xc & 1) == 0) {
LAB_00840819:
                if (((local_68->super_FunctionProxy).field_0x46 & 0x10) != 0) goto LAB_008408d2;
              }
              else if (((local_68->super_FunctionProxy).field_0x46 & 0x10) == 0) {
                if ((uVar2 >> 0xc & 1) != 0) goto LAB_008408d2;
                goto LAB_00840819;
              }
              cVar10 = Js::ParseableFunctionInfo::StartInDocument(this);
              if (cVar10 != pnodeParent->ichMin) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar18 = puStack_50;
                *puStack_50 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                   ,0xd07,
                                   "(pLastReuseFunc->StartInDocument() == pnodeParent->ichMin)",
                                   "pLastReuseFunc->StartInDocument() == pnodeParent->ichMin");
                if (!bVar9) goto LAB_0084113b;
                *puVar18 = 0;
              }
              if (this->m_cchLength != pnodeParent->ichLim - pnodeParent->ichMin) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar18 = puStack_50;
                *puStack_50 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                   ,0xd08,
                                   "(pLastReuseFunc->LengthInChars() == pnodeParent->LengthInCodepoints())"
                                   ,
                                   "pLastReuseFunc->LengthInChars() == pnodeParent->LengthInCodepoints()"
                                  );
                if (!bVar9) goto LAB_0084113b;
                *puVar18 = 0;
              }
              pNVar6 = (this->nestedArray).ptr;
              TVar11 = 0;
              TVar20 = 0;
              if (pNVar6 != (NestedArray *)0x0) {
                TVar20 = pNVar6->nestedCount;
              }
              pNVar6 = (local_68->nestedArray).ptr;
              if (pNVar6 != (NestedArray *)0x0) {
                TVar11 = pNVar6->nestedCount;
              }
              if (TVar20 != TVar11) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar18 = puStack_50;
                *puStack_50 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                   ,0xd09,
                                   "(pLastReuseFunc->GetNestedCount() == parentFunc->GetNestedCount())"
                                   ,
                                   "pLastReuseFunc->GetNestedCount() == parentFunc->GetNestedCount()"
                                  );
                if (!bVar9) goto LAB_0084113b;
                *puVar18 = 0;
              }
              pFVar17 = Js::ParseableFunctionInfo::GetNestedFunctionProxy(this,*local_60);
              if ((pFVar17 == (FunctionProxy *)0x0) ||
                 (bVar9 = Js::FunctionProxy::IsFunctionBody(pFVar17), !bVar9)) goto LAB_008408c4;
              bVar9 = Js::FunctionProxy::IsFunctionBody(pFVar17);
              if (!bVar9) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar18 = puStack_50;
                *puStack_50 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                   ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
                if (!bVar9) goto LAB_0084113b;
                *puVar18 = 0;
              }
            }
            *(FunctionProxy **)(prefix_local.m_fn + 0x1c8) = pFVar17;
          }
LAB_008408d2:
          pNVar6 = (local_68->nestedArray).ptr;
          if (pNVar6 == (NestedArray *)0x0) {
LAB_00840a0c:
            reuseNestedFunc = (ParseableFunctionInfo *)0x0;
          }
          else {
            if (pNVar6->nestedCount <= *local_60) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar18 = puStack_50;
              *puStack_50 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                 ,0xd23,"(*pIndex < parentNestedArray->nestedCount)",
                                 "*pIndex < parentNestedArray->nestedCount");
              if (!bVar9) goto LAB_0084113b;
              *puVar18 = 0;
            }
            this_00 = pNVar6[(ulong)*local_60 + 1];
            if ((this_00 == (NestedArray)0x0) ||
               (((Type *)((long)this_00 + 8))->ptr == (FunctionProxy *)0x0)) goto LAB_00840a0c;
            reuseNestedFunc = (ParseableFunctionInfo *)0x0;
            if ((*(Type *)((long)this_00 + 0x18) & DeferredDeserialize) == None) {
              reuseNestedFunc = Js::FunctionInfo::GetParseableFunctionInfo((FunctionInfo *)this_00);
              p_Var8 = prefix_local.m_fn;
              bVar9 = Js::ScriptContext::IsScriptContextInNonDebugMode
                                (*(ScriptContext **)prefix_local.m_fn);
              if ((((!bVar9) && ((*(byte *)(*(long *)(p_Var8 + 0x1b8) + 0xa8) & 4) == 0)) &&
                  (*(long *)(prefix_local.m_fn + 0x1c8) == 0)) &&
                 (bVar9 = Js::FunctionProxy::IsFunctionBody(&reuseNestedFunc->super_FunctionProxy),
                 bVar9)) {
                bVar9 = Js::FunctionProxy::IsFunctionBody(&reuseNestedFunc->super_FunctionProxy);
                if (!bVar9) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar18 = puStack_50;
                  *puStack_50 = 1;
                  bVar9 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                     ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
                  if (!bVar9) goto LAB_0084113b;
                  *puVar18 = 0;
                }
                *(ParseableFunctionInfo **)(prefix_local.m_fn + 0x1c8) = reuseNestedFunc;
              }
            }
          }
          PreVisitFunction(pPVar12,(ByteCodeGenerator *)prefix_local.m_fn,reuseNestedFunc);
          pFVar4 = pPVar12->funcInfo;
          FuncInfo::OnStartVisitFunction(local_70,pPVar12);
          p_Var8 = prefix_local.m_fn;
          if (pPVar12->pnodeBody != (ParseNodePtr)0x0) {
            bVar9 = Js::ScriptContext::IsScriptContextInNonDebugMode
                              (*(ScriptContext **)prefix_local.m_fn);
            bVar19 = 1;
            if (!bVar9) {
              bVar19 = (*(byte *)(*(long *)(p_Var8 + 0x1b8) + 0xa8) & 4) >> 2;
            }
            if (((this != (ParseableFunctionInfo *)0x0) && (bVar19 == 0)) &&
               ((*(long *)(prefix_local.m_fn + 0x1c8) == 0 &&
                ((pFVar17 = Js::ParseableFunctionInfo::GetNestedFunctionProxy(this,*local_60),
                 pFVar17 != (FunctionProxy *)0x0 &&
                 (bVar9 = Js::FunctionProxy::IsFunctionBody(pFVar17), !bVar9)))))) {
              body = (FunctionBody *)pFVar4->byteCodeFunction;
              bVar9 = Js::FunctionProxy::IsFunctionBody((FunctionProxy *)body);
              if (!bVar9) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar18 = puStack_50;
                *puStack_50 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                   ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
                if (!bVar9) goto LAB_0084113b;
                *puVar18 = 0;
              }
              Js::FunctionProxy::UpdateFunctionBodyImpl(pFVar17,body);
            }
            innerScope = pFVar4->paramScope;
            innerScope_00 = pFVar4->bodyScope;
            BeginVisitBlock(pPVar12->pnodeScopes,(ByteCodeGenerator *)prefix_local.m_fn);
            local_54 = 0;
            pPVar13 = pPVar12->pnodeScopes;
            ByteCodeGenerator::PushScope((ByteCodeGenerator *)prefix_local.m_fn,innerScope);
            if (((pPVar12->fncFlags & kFunctionHasNonSimpleParameterList) != kFunctionNone) &&
               ((pFVar4->field_0xb5 & 0x80) == 0)) {
              pFVar4->currentChildScope = innerScope;
              if (((pPVar13->super_ParseNodeStmt).super_ParseNode.nop != knopBlock) ||
                 (pPVar15 = ParseNode::AsParseNodeBlock((ParseNode *)pPVar13),
                 (~pPVar15->field_0x5c & 3) != 0)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar18 = puStack_50;
                *puStack_50 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                   ,0xd54,
                                   "(containerScope->nop == knopBlock && containerScope->AsParseNodeBlock()->blockType == Parameter)"
                                   ,
                                   "containerScope->nop == knopBlock && containerScope->AsParseNodeBlock()->blockType == Parameter"
                                  );
                if (!bVar9) goto LAB_0084113b;
                *puVar18 = 0;
              }
              pPVar15 = ParseNode::AsParseNodeBlock((ParseNode *)pPVar13);
              prefix_04.m_fn =
                   (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)
                   prefix_local.m_context;
              prefix_04.m_context = local_48;
              postfix_06.m_fn = postfix.m_fn;
              postfix_06.m_context = postfix.m_context;
              VisitNestedScopes<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                        (pPVar15->pnodeScopes,&pPVar12->super_ParseNode,
                         (ByteCodeGenerator *)prefix_local.m_fn,prefix_04,postfix_06,&local_54,true)
              ;
              pp_Stack_88 = &prefix_local.m_fn;
              _isMergedScope = &local_48;
              fn.prefix = (ParseNodeVisitor<SymCheck> *)_isMergedScope;
              fn.byteCodeGenerator = (ByteCodeGenerator **)pp_Stack_88;
              fn.postfix._0_4_ = (int)&postfix;
              fn.postfix._4_4_ = (int)((ulong)&postfix >> 0x20);
              local_78 = &postfix;
              MapFormalsImpl<VisitNestedScopes<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>(ParseNode*,ParseNode*,ByteCodeGenerator*,ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>,unsigned_int*,bool)::_lambda(ParseNode*)_1_,true>
                        (pPVar12,fn);
            }
            ByteCodeGenerator::PushScope((ByteCodeGenerator *)prefix_local.m_fn,innerScope_00);
            pFVar4->currentChildScope = innerScope_00;
            PreVisitBlock(pPVar12->pnodeBodyScope,(ByteCodeGenerator *)prefix_local.m_fn);
            AddVarsToScope(pPVar12->pnodeVars,(ByteCodeGenerator *)prefix_local.m_fn);
            if (((pPVar12->fncFlags & kFunctionHasNonSimpleParameterList) == kFunctionNone) ||
               ((pFVar4->field_0xb5 & 0x80) != 0)) {
              prefix_05.m_fn =
                   (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)
                   prefix_local.m_context;
              prefix_05.m_context = local_48;
              postfix_07.m_fn = postfix.m_fn;
              postfix_07.m_context = postfix.m_context;
              VisitNestedScopes<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                        ((ParseNode *)pPVar13,&pPVar12->super_ParseNode,
                         (ByteCodeGenerator *)prefix_local.m_fn,prefix_05,postfix_07,&local_54,false
                        );
              pp_Stack_88 = &prefix_local.m_fn;
              _isMergedScope = &local_48;
              fn_00.prefix = (ParseNodeVisitor<SymCheck> *)_isMergedScope;
              fn_00.byteCodeGenerator = (ByteCodeGenerator **)pp_Stack_88;
              fn_00.postfix._0_4_ = (int)&postfix;
              fn_00.postfix._4_4_ = (int)((ulong)&postfix >> 0x20);
              local_78 = &postfix;
              MapFormalsImpl<VisitNestedScopes<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>(ParseNode*,ParseNode*,ByteCodeGenerator*,ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>,unsigned_int*,bool)::_lambda(ParseNode*)_2_,true>
                        (pPVar12,fn_00);
            }
            if (((pPVar12->fncFlags & kFunctionHasNonSimpleParameterList) != kFunctionNone) &&
               (ByteCodeGenerator::AssignUndefinedConstRegister
                          ((ByteCodeGenerator *)prefix_local.m_fn), (pFVar4->field_0xb5 & 0x80) == 0
               )) {
              if (pPVar12->pnodeBodyScope->scope == (Scope *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar18 = puStack_50;
                *puStack_50 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                   ,0xd6c,"(pnodeFnc->pnodeBodyScope->scope)",
                                   "pnodeFnc->pnodeBodyScope->scope");
                if (!bVar9) {
LAB_0084113b:
                  pcVar7 = (code *)invalidInstructionException();
                  (*pcVar7)();
                }
                *puVar18 = 0;
              }
              prefix_06.m_fn =
                   (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)
                   prefix_local.m_context;
              prefix_06.m_context = local_48;
              postfix_08.m_fn = postfix.m_fn;
              postfix_08.m_context = postfix.m_context;
              VisitNestedScopes<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                        (pPVar12->pnodeBodyScope->pnodeScopes,&pPVar12->super_ParseNode,
                         (ByteCodeGenerator *)prefix_local.m_fn,prefix_06,postfix_08,&local_54,false
                        );
            }
            BeginVisitBlock(pPVar12->pnodeBodyScope,(ByteCodeGenerator *)prefix_local.m_fn);
            pnode_00 = pPVar12->pnodeBody;
            while (p_Var8 = prefix_local.m_fn, pnode_00->nop == knopList) {
              pPVar16 = ParseNode::AsParseNodeBin(pnode_00);
              *(ParseNodePtr *)(p_Var8 + 0x28) = pPVar16->pnode1;
              pPVar16 = ParseNode::AsParseNodeBin(pnode_00);
              prefix_07.m_fn =
                   (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)
                   prefix_local.m_context;
              prefix_07.m_context = local_48;
              postfix_01.m_fn = postfix.m_fn;
              postfix_01.m_context = postfix.m_context;
              Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                        (pPVar16->pnode1,(ByteCodeGenerator *)prefix_local.m_fn,prefix_07,postfix_01
                         ,(ParseNode *)0x0);
              if ((pFVar4->field_0xb4 & 6) == 0) {
                lVar5 = *(long *)(prefix_local.m_fn + 0x1b8);
                if ((*(long *)(lVar5 + 0x80) == 0) && ((*(byte *)(lVar5 + 0xa8) & 0x20) == 0)) {
                  bVar19 = 0;
                }
                else {
                  bVar19 = (*(byte *)(lVar5 + 0xa8) & 0x40) >> 6;
                }
                if ((bVar19 == 0) && ((DAT_015aa3d1 & 1) == 0)) {
                  pPVar16 = ParseNode::AsParseNodeBin(pnode_00);
                  MarkInit(pPVar16->pnode1);
                }
              }
              pPVar16 = ParseNode::AsParseNodeBin(pnode_00);
              pnode_00 = pPVar16->pnode2;
            }
            *(ParseNodePtr *)(prefix_local.m_fn + 0x28) = pnode_00;
            prefix_08.m_fn =
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)
                 prefix_local.m_context;
            prefix_08.m_context = local_48;
            postfix_02.m_fn = postfix.m_fn;
            postfix_02.m_context = postfix.m_context;
            Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                      (pnode_00,(ByteCodeGenerator *)prefix_local.m_fn,prefix_08,postfix_02,
                       (ParseNode *)0x0);
            EndVisitBlock(pPVar12->pnodeBodyScope,(ByteCodeGenerator *)prefix_local.m_fn);
            EndVisitBlock(pPVar12->pnodeScopes,(ByteCodeGenerator *)prefix_local.m_fn);
          }
          if (pPVar12->pnodeBody == (ParseNodePtr)0x0) {
            ByteCodeGenerator::PushScope((ByteCodeGenerator *)prefix_local.m_fn,pFVar4->paramScope);
            ByteCodeGenerator::PushScope((ByteCodeGenerator *)prefix_local.m_fn,pFVar4->bodyScope);
          }
          uVar3 = *(uint *)(prefix_local.m_fn + 0x10);
          bVar9 = FuncInfo::IsGlobalFunction(local_70);
          if ((!bVar9) || ((uVar3 & 0x1000) != 0)) {
            pPVar12->nestedIndex = *local_60;
            nestedFunc = (pFVar4->byteCodeFunction->super_FunctionProxy).functionInfo.ptr;
            index = *local_60;
            *local_60 = index + 1;
            Js::ParseableFunctionInfo::SetNestedFunc
                      (local_68,nestedFunc,index,*(uint32 *)(prefix_local.m_fn + 0x10));
          }
          FuncInfo::OnEndVisitFunction(local_70,pPVar12);
          PostVisitFunction(pPVar12,(ByteCodeGenerator *)prefix_local.m_fn);
          pnodeScopeList = pPVar12->pnodeNext;
          *(ParseableFunctionInfo **)(prefix_local.m_fn + 0x1c8) = this;
        }
        else {
          if (OVar1 != knopBlock) {
LAB_008410d9:
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar18 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar18 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                               ,0xdd5,"(false)","Unexpected opcode in tree of scopes");
            if (bVar9) {
              *puVar18 = 0;
              return;
            }
            goto LAB_0084113b;
          }
          pPVar13 = ParseNode::AsParseNodeBlock(pnodeScopeList);
          PreVisitBlock(pPVar13,(ByteCodeGenerator *)prefix_local.m_fn);
          pFVar4 = local_70;
          FuncInfo::OnStartVisitScope(local_70,pPVar13->scope,(bool *)&pp_Stack_88);
          prefix_00.m_fn =
               (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)prefix_local.m_context
          ;
          prefix_00.m_context = local_48;
          postfix_03.m_fn = postfix.m_fn;
          postfix_03.m_context = postfix.m_context;
          VisitNestedScopes<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                    (pPVar13->pnodeScopes,pnodeParent,(ByteCodeGenerator *)prefix_local.m_fn,
                     prefix_00,postfix_03,local_60,false);
          FuncInfo::OnEndVisitScope(pFVar4,pPVar13->scope,pp_Stack_88._0_1_);
          PostVisitBlock(pPVar13,(ByteCodeGenerator *)prefix_local.m_fn);
          pPVar13 = ParseNode::AsParseNodeBlock(pnodeScopeList);
          pnodeScopeList = pPVar13->pnodeNext;
        }
      }
      else if (OVar1 == knopWith) {
        PreVisitWith(pnodeScopeList,(ByteCodeGenerator *)prefix_local.m_fn);
        pPVar14 = ParseNode::AsParseNodeWith(pnodeScopeList);
        pFVar4 = local_70;
        FuncInfo::OnStartVisitScope(local_70,pPVar14->scope,(bool *)&pp_Stack_88);
        pPVar14 = ParseNode::AsParseNodeWith(pnodeScopeList);
        prefix_03.m_fn =
             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)prefix_local.m_context;
        prefix_03.m_context = local_48;
        postfix_05.m_fn = postfix.m_fn;
        postfix_05.m_context = postfix.m_context;
        VisitNestedScopes<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                  (pPVar14->pnodeScopes,pnodeParent,(ByteCodeGenerator *)prefix_local.m_fn,prefix_03
                   ,postfix_05,local_60,false);
        pPVar14 = ParseNode::AsParseNodeWith(pnodeScopeList);
        FuncInfo::OnEndVisitScope(pFVar4,pPVar14->scope,pp_Stack_88._0_1_);
        ByteCodeGenerator::PopScope((ByteCodeGenerator *)prefix_local.m_fn);
        pPVar14 = ParseNode::AsParseNodeWith(pnodeScopeList);
        pnodeScopeList = pPVar14->pnodeNext;
      }
      else {
        if (OVar1 != knopCatch) goto LAB_008410d9;
        pnodeCatch = ParseNode::AsParseNodeCatch(pnodeScopeList);
        PreVisitCatch(pnodeCatch,(ByteCodeGenerator *)prefix_local.m_fn);
        pnode = pnodeCatch->pnodeParam;
        if ((pnode != (ParseNode *)0x0) && (pnode->nop != knopParamPattern)) {
          prefix_01.m_fn =
               (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)prefix_local.m_context
          ;
          prefix_01.m_context = local_48;
          postfix_00.m_fn = postfix.m_fn;
          postfix_00.m_context = postfix.m_context;
          Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                    (pnode,(ByteCodeGenerator *)prefix_local.m_fn,prefix_01,postfix_00,
                     (ParseNode *)0x0);
        }
        pFVar4 = local_70;
        FuncInfo::OnStartVisitScope(local_70,pnodeCatch->scope,(bool *)&pp_Stack_88);
        prefix_02.m_fn =
             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)prefix_local.m_context;
        prefix_02.m_context = local_48;
        postfix_04.m_fn = postfix.m_fn;
        postfix_04.m_context = postfix.m_context;
        VisitNestedScopes<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                  (pnodeCatch->pnodeScopes,pnodeParent,(ByteCodeGenerator *)prefix_local.m_fn,
                   prefix_02,postfix_04,local_60,false);
        FuncInfo::OnEndVisitScope(pFVar4,pnodeCatch->scope,pp_Stack_88._0_1_);
        PostVisitCatch((ParseNode *)pnodeCatch,(ByteCodeGenerator *)prefix_local.m_fn);
        pnodeScopeList = pnodeCatch->pnodeNext;
      }
    } while ((ParseNodeBlock *)pnodeScopeList != (ParseNodeBlock *)0x0);
  }
  return;
}

Assistant:

void VisitNestedScopes(ParseNode* pnodeScopeList, ParseNode* pnodeParent, ByteCodeGenerator* byteCodeGenerator,
    PrefixFn prefix, PostfixFn postfix, uint *pIndex, bool breakOnBodyScope = false)
{
    // Visit all scopes nested in this scope before visiting this function's statements. This way we have all the
    // attributes of all the inner functions before we assign registers within this function.
    // All the attributes we need to propagate downward should already be recorded by the parser.
    // - call to "eval()"
    // - nested in "with"
    FuncInfo * parentFuncInfo = pnodeParent->AsParseNodeFnc()->funcInfo;
    Js::ParseableFunctionInfo* parentFunc = parentFuncInfo->byteCodeFunction;
    ParseNode* pnodeScope;
    uint i = 0;

    // Cache to restore it back once we come out of current function.
    Js::FunctionBody * pLastReuseFunc = byteCodeGenerator->pCurrentFunction;

    for (pnodeScope = pnodeScopeList; pnodeScope;)
    {
        if (breakOnBodyScope && pnodeScope == pnodeParent->AsParseNodeFnc()->pnodeBodyScope)
        {
            break;
        }

        switch (pnodeScope->nop)
        {
        case knopFncDecl:
        {
            ParseNodeFnc * pnodeFnc = pnodeScope->AsParseNodeFnc();
            if (pLastReuseFunc)
            {
                if (!byteCodeGenerator->IsInNonDebugMode())
                {
                    // Here we are trying to match the inner sub-tree as well with already created inner function.

                    if ((pLastReuseFunc->GetIsGlobalFunc() && parentFunc->GetIsGlobalFunc())
                        || (!pLastReuseFunc->GetIsGlobalFunc() && !parentFunc->GetIsGlobalFunc()))
                    {
                        Assert(pLastReuseFunc->StartInDocument() == pnodeParent->ichMin);
                        Assert(pLastReuseFunc->LengthInChars() == pnodeParent->LengthInCodepoints());
                        Assert(pLastReuseFunc->GetNestedCount() == parentFunc->GetNestedCount());

                        // If the current function is not parsed yet, its function body is not generated yet.
                        // Reset pCurrentFunction to null so that it will not be able re-use anything.
                        Js::FunctionProxy* proxy = pLastReuseFunc->GetNestedFunctionProxy((*pIndex));
                        if (proxy && proxy->IsFunctionBody())
                        {
                            byteCodeGenerator->pCurrentFunction = proxy->GetFunctionBody();
                        }
                        else
                        {
                            byteCodeGenerator->pCurrentFunction = nullptr;
                        }
                    }
                }
                else if (!parentFunc->GetIsGlobalFunc())
                {
                    // In the deferred parsing mode, we will be reusing the only one function (which is asked when on ::Begin) all inner function will be created.
                    byteCodeGenerator->pCurrentFunction = nullptr;
                }
            }

            Js::ParseableFunctionInfo::NestedArray * parentNestedArray = parentFunc->GetNestedArray();
            Js::ParseableFunctionInfo* reuseNestedFunc = nullptr;
            if (parentNestedArray)
            {
                Assert(*pIndex < parentNestedArray->nestedCount);
                Js::FunctionInfo * info = parentNestedArray->functionInfoArray[*pIndex];
                if (info && info->HasParseableInfo())
                {
                    reuseNestedFunc = info->GetParseableFunctionInfo();

                    // If parentFunc was redeferred, try to set pCurrentFunction to this FunctionBody,
                    // and cleanup to reparse (as previous cleanup stops at redeferred parentFunc).
                    if (!byteCodeGenerator->IsInNonDebugMode()
                        && !byteCodeGenerator->pCurrentFunction
                        && reuseNestedFunc->IsFunctionBody())
                    {
                        byteCodeGenerator->pCurrentFunction = reuseNestedFunc->GetFunctionBody();
                    }
                }
            }
            PreVisitFunction(pnodeFnc, byteCodeGenerator, reuseNestedFunc);
            FuncInfo *funcInfo = pnodeFnc->funcInfo;

            parentFuncInfo->OnStartVisitFunction(pnodeFnc);

            if (pnodeFnc->pnodeBody)
            {
                if (!byteCodeGenerator->IsInNonDebugMode() && pLastReuseFunc != nullptr && byteCodeGenerator->pCurrentFunction == nullptr)
                {
                    // Patch current non-parsed function's FunctionBodyImpl with the new generated function body.
                    // So that the function object (pointing to the old function body) can able to get to the new one.

                    Js::FunctionProxy* proxy = pLastReuseFunc->GetNestedFunctionProxy((*pIndex));
                    if (proxy && !proxy->IsFunctionBody())
                    {
                        proxy->UpdateFunctionBodyImpl(funcInfo->byteCodeFunction->GetFunctionBody());
                    }
                }

                Scope *paramScope = funcInfo->GetParamScope();
                Scope *bodyScope = funcInfo->GetBodyScope();

                BeginVisitBlock(pnodeFnc->pnodeScopes, byteCodeGenerator);
                i = 0;
                ParseNodePtr containerScope = pnodeFnc->pnodeScopes;

                // Push the param scope
                byteCodeGenerator->PushScope(paramScope);

                if (pnodeFnc->HasNonSimpleParameterList() && !funcInfo->IsBodyAndParamScopeMerged())
                {
                    // Set param scope as the current child scope.
                    funcInfo->SetCurrentChildScope(paramScope);
                    Assert(containerScope->nop == knopBlock && containerScope->AsParseNodeBlock()->blockType == Parameter);
                    VisitNestedScopes(containerScope->AsParseNodeBlock()->pnodeScopes, pnodeFnc, byteCodeGenerator, prefix, postfix, &i, true);
                    MapFormals(pnodeFnc, [&](ParseNode *argNode) { Visit(argNode, byteCodeGenerator, prefix, postfix); });
                }

                // Push the body scope
                byteCodeGenerator->PushScope(bodyScope);
                funcInfo->SetCurrentChildScope(bodyScope);

                PreVisitBlock(pnodeFnc->pnodeBodyScope, byteCodeGenerator);
                AddVarsToScope(pnodeFnc->pnodeVars, byteCodeGenerator);

                if (!pnodeFnc->HasNonSimpleParameterList() || funcInfo->IsBodyAndParamScopeMerged())
                {
                    VisitNestedScopes(containerScope, pnodeFnc, byteCodeGenerator, prefix, postfix, &i);
                    MapFormals(pnodeFnc, [&](ParseNode *argNode) { Visit(argNode, byteCodeGenerator, prefix, postfix); });
                }

                if (pnodeFnc->HasNonSimpleParameterList())
                {
                    byteCodeGenerator->AssignUndefinedConstRegister();

                    if (!funcInfo->IsBodyAndParamScopeMerged())
                    {
                        Assert(pnodeFnc->pnodeBodyScope->scope);
                        VisitNestedScopes(pnodeFnc->pnodeBodyScope->pnodeScopes, pnodeFnc, byteCodeGenerator, prefix, postfix, &i);
                    }
                }

                BeginVisitBlock(pnodeFnc->pnodeBodyScope, byteCodeGenerator);

                ParseNode* pnode = pnodeFnc->pnodeBody;
                while (pnode->nop == knopList)
                {
                    // Check to see whether initializations of locals to "undef" can be skipped.
                    // The logic to do this is cheap - omit the init if we see an init with a value
                    // on the RHS at the top statement level (i.e., not inside a block, try, loop, etc.)
                    // before we see a use. The motivation is to help identify single-def locals in the BE.
                    // Note that this can't be done for globals.
                    byteCodeGenerator->SetCurrentTopStatement(pnode->AsParseNodeBin()->pnode1);
                    Visit(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator, prefix, postfix);
                    if (!funcInfo->GetCallsEval() && !funcInfo->GetChildCallsEval() &&
                        // So that it will not be marked as init thus it will be added to the diagnostics symbols container.
                        !(byteCodeGenerator->ShouldTrackDebuggerMetadata()))
                    {
                        MarkInit(pnode->AsParseNodeBin()->pnode1);
                    }
                    pnode = pnode->AsParseNodeBin()->pnode2;
                }
                byteCodeGenerator->SetCurrentTopStatement(pnode);
                Visit(pnode, byteCodeGenerator, prefix, postfix);

                EndVisitBlock(pnodeFnc->pnodeBodyScope, byteCodeGenerator);
                EndVisitBlock(pnodeFnc->pnodeScopes, byteCodeGenerator);
            }

            if (!pnodeFnc->pnodeBody)
            {
                // For defer prase scenario push the scopes here
                byteCodeGenerator->PushScope(funcInfo->GetParamScope());
                byteCodeGenerator->PushScope(funcInfo->GetBodyScope());
            }

            if (!parentFuncInfo->IsFakeGlobalFunction(byteCodeGenerator->GetFlags()))
            {
                pnodeFnc->nestedIndex = *pIndex;
                parentFunc->SetNestedFunc(funcInfo->byteCodeFunction->GetFunctionInfo(), (*pIndex)++, byteCodeGenerator->GetFlags());
            }

            Assert(parentFunc);

            parentFuncInfo->OnEndVisitFunction(pnodeFnc);

            PostVisitFunction(pnodeFnc, byteCodeGenerator);

            pnodeScope = pnodeFnc->pnodeNext;

            byteCodeGenerator->pCurrentFunction = pLastReuseFunc;
            break;
        }

        case knopBlock:
        {
            ParseNodeBlock * pnodeBlockScope = pnodeScope->AsParseNodeBlock();
            PreVisitBlock(pnodeBlockScope, byteCodeGenerator);
            bool isMergedScope;
            parentFuncInfo->OnStartVisitScope(pnodeBlockScope->scope, &isMergedScope);
            VisitNestedScopes(pnodeBlockScope->pnodeScopes, pnodeParent, byteCodeGenerator, prefix, postfix, pIndex);
            parentFuncInfo->OnEndVisitScope(pnodeBlockScope->scope, isMergedScope);
            PostVisitBlock(pnodeBlockScope, byteCodeGenerator);

            pnodeScope = pnodeScope->AsParseNodeBlock()->pnodeNext;
            break;
        }

        case knopCatch:
        {
            ParseNodeCatch * pnodeCatchScope = pnodeScope->AsParseNodeCatch();
            PreVisitCatch(pnodeCatchScope, byteCodeGenerator);

            if (pnodeCatchScope->HasParam() && !pnodeCatchScope->HasPatternParam())
            {
                Visit(pnodeCatchScope->GetParam(), byteCodeGenerator, prefix, postfix);
            }

            bool isMergedScope;
            parentFuncInfo->OnStartVisitScope(pnodeCatchScope->scope, &isMergedScope);
            VisitNestedScopes(pnodeCatchScope->pnodeScopes, pnodeParent, byteCodeGenerator, prefix, postfix, pIndex);

            parentFuncInfo->OnEndVisitScope(pnodeCatchScope->scope, isMergedScope);
            PostVisitCatch(pnodeCatchScope, byteCodeGenerator);

            pnodeScope = pnodeCatchScope->pnodeNext;
            break;
        }

        case knopWith:
        {
            PreVisitWith(pnodeScope, byteCodeGenerator);
            bool isMergedScope;
            parentFuncInfo->OnStartVisitScope(pnodeScope->AsParseNodeWith()->scope, &isMergedScope);
            VisitNestedScopes(pnodeScope->AsParseNodeWith()->pnodeScopes, pnodeParent, byteCodeGenerator, prefix, postfix, pIndex);
            parentFuncInfo->OnEndVisitScope(pnodeScope->AsParseNodeWith()->scope, isMergedScope);
            PostVisitWith(pnodeScope, byteCodeGenerator);
            pnodeScope = pnodeScope->AsParseNodeWith()->pnodeNext;
            break;
        }

        default:
            AssertMsg(false, "Unexpected opcode in tree of scopes");
            return;
        }
    }
}